

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int BoolTest(lua_State *L)

{
  bool bVal;
  LuaArgType LVar1;
  
  LVar1 = CLua::GetArgumentType(pLua,1);
  if (LVar1 != ARG_TYPE_BOOL) {
    puts("Fail: BoolTest argument is not a Boolean");
    sLuaBasedTestResult = sLuaBasedTestResult + -7;
  }
  bVal = CLua::GetBoolArgument(pLua,1,false);
  CLua::PushBool(pLua,bVal);
  return 1;
}

Assistant:

LuaGlue(BoolTest)
{
    if (pLua->GetArgumentType(1) != LuaArgType::ARG_TYPE_BOOL)
    {
        printf("Fail: BoolTest argument is not a Boolean\n");
        sLuaBasedTestResult += -7;
    }
    bool r = pLua->GetBoolArgument(1);
    pLua->PushBool(r);
    return 1;
}